

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_refinement.cpp
# Opt level: O0

void __thiscall duckdb::CSVSniffer::RefineTypes(CSVSniffer *this)

{
  undefined8 uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar5;
  size_type sVar6;
  size_type sVar7;
  pointer pSVar8;
  idx_t iVar9;
  value_type *__x;
  value_type *pvVar10;
  long in_RDI;
  LogicalType *in_stack_000000a0;
  idx_t in_stack_000000a8;
  Vector *in_stack_000000b0;
  CSVSniffer *in_stack_000000b8;
  LogicalType d_type_1;
  idx_t column_idx_1;
  value_type *sql_type;
  bool is_bool_type;
  vector<duckdb::LogicalType,_true> *col_type_candidates;
  idx_t col;
  DataChunk *parse_chunk;
  LogicalType d_type;
  idx_t column_idx;
  bool finished_file;
  idx_t i;
  CSVStateMachine *sniffing_state_machine;
  LogicalType *in_stack_fffffffffffffdf8;
  CSVStateMachine *in_stack_fffffffffffffe00;
  BaseScanner *in_stack_fffffffffffffe08;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffe20;
  LogicalType *this_00;
  StringValueResult *in_stack_fffffffffffffe40;
  byte local_1b1;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 local_f8 [56];
  reference local_c0;
  byte local_99;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_98;
  ulong local_90;
  DataChunk *local_88;
  ulong local_50;
  undefined1 local_41;
  ulong local_40;
  CSVStateMachine *local_10;
  
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>::
  operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              *)in_stack_fffffffffffffe00);
  local_10 = BaseScanner::GetStateMachine((BaseScanner *)0x176ec83);
  LogicalType::LogicalType
            (in_stack_fffffffffffffe20,(LogicalTypeId)((ulong)in_stack_fffffffffffffe18 >> 0x38));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::assign
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,(value_type *)0x176ecf2)
  ;
  LogicalType::~LogicalType((LogicalType *)0x176ed01);
  if ((local_10->options->all_varchar & 1U) == 0) {
    for (local_40 = 1; local_40 < local_10->options->sample_size_chunks; local_40 = local_40 + 1) {
      unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
      ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                    *)in_stack_fffffffffffffe00);
      local_41 = BaseScanner::FinishedFile(in_stack_fffffffffffffe08);
      if ((bool)local_41) {
        vector<duckdb::LogicalType,_true>::clear((vector<duckdb::LogicalType,_true> *)0x176edb5);
        for (local_50 = 0; uVar2 = local_50,
            sVar4 = ::std::
                    unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                    ::size((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                            *)0x176ede5), uVar2 < sVar4; local_50 = local_50 + 1) {
          ::std::
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          ::operator[]((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                        *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
          vector<duckdb::LogicalType,_true>::back
                    ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          pvVar5 = &::std::
                    unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                    ::operator[]((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                                  *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8)
                    ->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
          sVar6 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                            (pvVar5);
          sVar7 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                            (&(local_10->options->auto_type_candidates).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            );
          if (sVar6 == sVar7) {
            LogicalType::LogicalType
                      (in_stack_fffffffffffffe20,
                       (LogicalTypeId)((ulong)in_stack_fffffffffffffe18 >> 0x38));
            LogicalType::operator=
                      ((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            LogicalType::~LogicalType((LogicalType *)0x176eecf);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
          LogicalType::~LogicalType((LogicalType *)0x176ef22);
        }
        return;
      }
      pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                             *)in_stack_fffffffffffffe00);
      (*(pSVar8->super_BaseScanner)._vptr_BaseScanner[2])();
      local_88 = StringValueResult::ToChunk(in_stack_fffffffffffffe40);
      local_90 = 0;
LAB_0176ef79:
      uVar2 = local_90;
      iVar9 = DataChunk::ColumnCount((DataChunk *)0x176ef96);
      if (uVar2 < iVar9) {
        local_98 = &::std::
                    unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                    ::operator[]((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                                  *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8)
                    ->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
        vector<duckdb::LogicalType,_true>::back
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
        LogicalType::LogicalType
                  (in_stack_fffffffffffffe20,
                   (LogicalTypeId)((ulong)in_stack_fffffffffffffe18 >> 0x38));
        bVar3 = LogicalType::operator==
                          ((LogicalType *)in_stack_fffffffffffffe08,
                           (LogicalType *)in_stack_fffffffffffffe00);
        LogicalType::~LogicalType((LogicalType *)0x176f022);
        local_99 = bVar3;
        while (sVar6 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
                       size(local_98), 1 < sVar6) {
          local_c0 = vector<duckdb::LogicalType,_true>::back
                               ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe00,
                     (size_type)in_stack_fffffffffffffdf8);
          DataChunk::size(local_88);
          bVar3 = TryCastVector(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                                in_stack_000000a0);
          if (bVar3) break;
          vector<duckdb::LogicalType,_true>::back
                    ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
          LogicalType::LogicalType
                    (in_stack_fffffffffffffe20,
                     (LogicalTypeId)((ulong)in_stack_fffffffffffffe18 >> 0x38));
          in_stack_fffffffffffffe67 =
               LogicalType::operator==
                         ((LogicalType *)in_stack_fffffffffffffe08,
                          (LogicalType *)in_stack_fffffffffffffe00);
          local_1b1 = 0;
          if ((bool)in_stack_fffffffffffffe67) {
            local_1b1 = local_99;
          }
          LogicalType::~LogicalType((LogicalType *)0x176f142);
          if ((local_1b1 & 1) != 0) goto LAB_0176f151;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x176f210)
          ;
        }
        goto LAB_0176f215;
      }
      DataChunk::Reset((DataChunk *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      DataChunk::SetCapacity(local_88,0x800);
    }
    vector<duckdb::LogicalType,_true>::clear((vector<duckdb::LogicalType,_true> *)0x176f27c);
    for (local_f8._0_8_ = 0; uVar1 = local_f8._0_8_,
        sVar4 = ::std::
                unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                ::size((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                        *)0x176f2a9), (ulong)uVar1 < sVar4; local_f8._0_8_ = local_f8._0_8_ + 1) {
      id = (LogicalTypeId)((ulong)(in_RDI + 0x150) >> 0x38);
      this_00 = (LogicalType *)local_f8;
      ::std::
      unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
      ::operator[]((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                    *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
      vector<duckdb::LogicalType,_true>::back
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
      LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      pvVar5 = &::std::
                unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                ::operator[]((unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                              *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8)->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
      __x = (value_type *)
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(pvVar5);
      pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                             *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe00 = BaseScanner::GetStateMachine((BaseScanner *)0x176f342);
      pvVar10 = (value_type *)
                ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                          (&(in_stack_fffffffffffffe00->options->auto_type_candidates).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
      ;
      if ((__x == pvVar10) && ((*(byte *)(in_RDI + 0x250) & 1) != 0)) {
        LogicalType::LogicalType(this_00,id);
        LogicalType::operator=((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        LogicalType::~LogicalType((LogicalType *)0x176f3b2);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)pSVar8,__x);
      LogicalType::~LogicalType((LogicalType *)0x176f402);
    }
  }
  return;
LAB_0176f151:
  while( true ) {
    vector<duckdb::LogicalType,_true>::back
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe40 = (StringValueResult *)(local_f8 + 8);
    LogicalType::LogicalType
              (in_stack_fffffffffffffe20,(LogicalTypeId)((ulong)in_stack_fffffffffffffe18 >> 0x38));
    bVar3 = LogicalType::operator!=
                      ((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    LogicalType::~LogicalType((LogicalType *)0x176f19c);
    if (!bVar3) break;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x176f1b3);
  }
LAB_0176f215:
  local_90 = local_90 + 1;
  goto LAB_0176ef79;
}

Assistant:

void CSVSniffer::RefineTypes() {
	auto &sniffing_state_machine = best_candidate->GetStateMachine();
	// if data types were provided, exit here if number of columns does not match
	detected_types.assign(sniffing_state_machine.dialect_options.num_cols, LogicalType::VARCHAR);
	if (sniffing_state_machine.options.all_varchar) {
		// return all types varchar
		return;
	}
	for (idx_t i = 1; i < sniffing_state_machine.options.sample_size_chunks; i++) {
		bool finished_file = best_candidate->FinishedFile();
		if (finished_file) {
			// we finished the file: stop
			// set sql types
			detected_types.clear();
			for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
				LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
				if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
				    sniffing_state_machine.options.auto_type_candidates.size()) {
					d_type = LogicalType::VARCHAR;
				}
				detected_types.push_back(d_type);
			}
			return;
		}
		auto &parse_chunk = best_candidate->ParseChunk().ToChunk();

		for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
			vector<LogicalType> &col_type_candidates = best_sql_types_candidates_per_column_idx[col];
			bool is_bool_type = col_type_candidates.back() == LogicalType::BOOLEAN;
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				if (TryCastVector(parse_chunk.data[col], parse_chunk.size(), sql_type)) {
					break;
				}
				if (col_type_candidates.back() == LogicalType::BOOLEAN && is_bool_type) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		// reset parse chunk for the next iteration
		parse_chunk.Reset();
		parse_chunk.SetCapacity(CSVReaderOptions::sniff_size);
	}
	detected_types.clear();
	// set sql types
	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
		        best_candidate->GetStateMachine().options.auto_type_candidates.size() &&
		    default_null_to_varchar) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
}